

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::NewArrayExpression::fromSyntax
          (Compilation *compilation,NewArrayExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Type *pTVar3;
  Expression *pEVar4;
  NewArrayExpression *expr;
  SourceRange SVar5;
  Expression *initExpr;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffb8;
  Expression *local_40;
  SourceRange local_38;
  
  if (assignmentTarget == (Type *)0x0) {
    SVar5 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0x7a0007,SVar5);
    assignmentTarget = compilation->errorType;
  }
  else {
    pTVar3 = Type::getCanonicalType(assignmentTarget);
    if (((pTVar3->super_Symbol).kind != DynamicArrayType) &&
       (bVar2 = Type::isError(assignmentTarget), !bVar2)) {
      SVar5 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      ASTContext::addDiag(context,(DiagCode)0x7a0007,SVar5);
    }
  }
  pEVar4 = Expression::selfDetermined
                     (compilation,(syntax->sizeExpr).ptr,context,(bitmask<slang::ast::ASTFlags>)0x0)
  ;
  local_40 = (Expression *)0x0;
  if (syntax->initializer != (ParenthesizedExpressionSyntax *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = context;
    local_40 = Expression::bindRValue
                         ((Expression *)assignmentTarget,
                          (Type *)(syntax->initializer->expression).ptr,(ExpressionSyntax *)0x0,
                          (SourceRange)(auVar1 << 0x40),(ASTContext *)0x0,in_stack_ffffffffffffffb8)
    ;
  }
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::NewArrayExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression_const*&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,assignmentTarget,pEVar4,&local_40,&local_38);
  bVar2 = Expression::bad(pEVar4);
  if ((!bVar2) &&
     (((local_40 == (Expression *)0x0 || (bVar2 = Expression::bad(local_40), !bVar2)) &&
      (bVar2 = ASTContext::requireIntegral(context,pEVar4), bVar2)))) {
    return &expr->super_Expression;
  }
  pEVar4 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar4;
}

Assistant:

Expression& NewArrayExpression::fromSyntax(Compilation& compilation,
                                           const NewArrayExpressionSyntax& syntax,
                                           const ASTContext& context,
                                           const Type* assignmentTarget) {
    if (!assignmentTarget ||
        assignmentTarget->getCanonicalType().kind != SymbolKind::DynamicArrayType) {

        if (!assignmentTarget || !assignmentTarget->isError())
            context.addDiag(diag::NewArrayTarget, syntax.sourceRange());

        if (!assignmentTarget)
            assignmentTarget = &compilation.getErrorType();
    }

    auto& sizeExpr = selfDetermined(compilation, *syntax.sizeExpr, context);
    const Expression* initExpr = nullptr;
    if (syntax.initializer)
        initExpr = &bindRValue(*assignmentTarget, *syntax.initializer->expression, {}, context);

    auto result = compilation.emplace<NewArrayExpression>(*assignmentTarget, sizeExpr, initExpr,
                                                          syntax.sourceRange());
    if (sizeExpr.bad() || (initExpr && initExpr->bad()))
        return badExpr(compilation, result);

    if (!context.requireIntegral(sizeExpr))
        return badExpr(compilation, result);

    return *result;
}